

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_paramSwitch_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  ZSTD_strategy ZVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  U64 UVar8;
  U64 UVar9;
  uint *puVar10;
  ZSTD_match_t *pZVar11;
  ZSTD_optimal_t *pZVar12;
  byte bVar13;
  uint uVar14;
  void *pvVar15;
  int iVar16;
  U32 UVar17;
  uint uVar18;
  ulong __n;
  size_t sVar19;
  int iVar20;
  void *__s;
  size_t bytes;
  ulong bytes_00;
  
  if (((forWho == ZSTD_resetTarget_CDict) && (ms->dedicatedDictSearch != 0)) ||
     ((cParams->strategy != ZSTD_fast &&
      (useRowMatchFinder != ZSTD_ps_enable || 2 < cParams->strategy - ZSTD_greedy)))) {
    sVar19 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  else {
    sVar19 = 0;
  }
  bVar13 = (byte)cParams->hashLog;
  bytes = 1L << (bVar13 & 0x3f);
  uVar18 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->minMatch == 3)) {
    uVar18 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar18 = cParams->windowLog;
    }
  }
  if (forceResetIndex == ZSTDirp_reset) {
    *(undefined8 *)&(ms->window).nbOverflowCorrections = 0;
    iVar20 = 0x217aa91;
    (ms->window).base = " ";
    (ms->window).dictBase = " ";
    iVar16 = 0x217aa93;
    (ms->window).nextSrc = (BYTE *)"id-ce-certificatePolicies";
    pvVar15 = ws->objectEnd;
    ws->tableValidEnd = pvVar15;
  }
  else {
    iVar16 = (int)(ms->window).nextSrc;
    iVar20 = (int)(ms->window).base;
    pvVar15 = ws->objectEnd;
  }
  ms->hashLog3 = uVar18;
  ms->lazySkipping = 0;
  UVar17 = iVar16 - iVar20;
  (ms->window).lowLimit = UVar17;
  (ms->window).dictLimit = UVar17;
  ms->nextToUpdate = UVar17;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  ws->tableEnd = pvVar15;
  pUVar6 = (U32 *)ZSTD_cwksp_reserve_table(ws,4L << (bVar13 & 0x3f));
  ms->hashTable = pUVar6;
  pUVar6 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar19);
  ms->chainTable = pUVar6;
  sVar19 = 4L << ((byte)uVar18 & 0x3f);
  if (uVar18 == 0) {
    sVar19 = 0;
  }
  pUVar6 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar19);
  ms->hashTable3 = pUVar6;
  if (ws->allocFailed == '\0') {
    if (crp != ZSTDcrp_leaveDirty) {
      pvVar15 = ws->tableEnd;
      __s = ws->tableValidEnd;
      if (__s < pvVar15) {
        switchD_014c3389::default(__s,0,(long)pvVar15 - (long)__s);
        pvVar15 = ws->tableEnd;
        __s = ws->tableValidEnd;
      }
      if (__s < pvVar15) {
        ws->tableValidEnd = pvVar15;
      }
    }
    if ((useRowMatchFinder == ZSTD_ps_enable) && (0xfffffffc < cParams->strategy - ZSTD_btlazy2)) {
      if (forWho == ZSTD_resetTarget_CCtx) {
        bytes_00 = bytes + 0x3f & 0xffffffffffffffc0;
        pBVar7 = (BYTE *)ZSTD_cwksp_reserve_internal(ws,bytes_00,ZSTD_cwksp_alloc_aligned_init_once)
        ;
        if ((pBVar7 != (BYTE *)0x0) && (pBVar7 < ws->initOnceStart)) {
          __n = (long)ws->initOnceStart - (long)pBVar7;
          if (bytes_00 <= __n) {
            __n = bytes_00;
          }
          switchD_014c3389::default(pBVar7,0,__n);
          ws->initOnceStart = pBVar7;
        }
        ms->tagTable = pBVar7;
        UVar8 = ZSTD_bitmix(ms->hashSalt,8);
        UVar9 = ZSTD_bitmix((ulong)ms->hashSaltEntropy,4);
        ms->hashSalt = UVar9 ^ UVar8;
      }
      else {
        pBVar7 = (BYTE *)ZSTD_cwksp_reserve_aligned(ws,bytes);
        ms->tagTable = pBVar7;
        switchD_014c3389::default(pBVar7,0,bytes);
        ms->hashSalt = 0;
      }
      uVar18 = 6;
      if (cParams->searchLog < 6) {
        uVar18 = cParams->searchLog;
      }
      uVar14 = 4;
      if (4 < uVar18) {
        uVar14 = uVar18;
      }
      ms->rowHashLog = cParams->hashLog - uVar14;
    }
    if ((forWho == ZSTD_resetTarget_CCtx) && (6 < (int)cParams->strategy)) {
      puVar10 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x400);
      (ms->opt).litFreq = puVar10;
      puVar10 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x90);
      (ms->opt).litLengthFreq = puVar10;
      puVar10 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0xd4);
      (ms->opt).matchLengthFreq = puVar10;
      puVar10 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x80);
      (ms->opt).offCodeFreq = puVar10;
      pZVar11 = (ZSTD_match_t *)ZSTD_cwksp_reserve_aligned(ws,0x8018);
      (ms->opt).matchTable = pZVar11;
      pZVar12 = (ZSTD_optimal_t *)ZSTD_cwksp_reserve_aligned(ws,0x1c054);
      (ms->opt).priceTable = pZVar12;
    }
    uVar2 = cParams->windowLog;
    uVar3 = cParams->chainLog;
    uVar4 = cParams->hashLog;
    uVar5 = cParams->searchLog;
    uVar18 = cParams->minMatch;
    uVar14 = cParams->targetLength;
    ZVar1 = cParams->strategy;
    (ms->cParams).searchLog = cParams->searchLog;
    (ms->cParams).minMatch = uVar18;
    (ms->cParams).targetLength = uVar14;
    (ms->cParams).strategy = ZVar1;
    (ms->cParams).windowLog = uVar2;
    (ms->cParams).chainLog = uVar3;
    (ms->cParams).hashLog = uVar4;
    (ms->cParams).searchLog = uVar5;
    sVar19 = (ulong)(ws->allocFailed == '\0') * 0x40 - 0x40;
  }
  else {
    sVar19 = 0xffffffffffffffc0;
  }
  return sVar19;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_paramSwitch_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_ps_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;
    ms->lazySkipping = 0;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        /* Row match finder needs an additional table of hashes ("tags") */
        size_t const tagTableSize = hSize;
        /* We want to generate a new salt in case we reset a Cctx, but we always want to use
         * 0 when we reset a Cdict */
        if(forWho == ZSTD_resetTarget_CCtx) {
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned_init_once(ws, tagTableSize);
            ZSTD_advanceHashSalt(ms);
        } else {
            /* When we are not salting we want to always memset the memory */
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            ZSTD_memset(ms->tagTable, 0, tagTableSize);
            ms->hashSalt = 0;
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = BOUNDED(4, cParams->searchLog, 6);
            assert(cParams->hashLog >= rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, ZSTD_OPT_SIZE * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, ZSTD_OPT_SIZE * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}